

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void sdf_tools::exportVectorTypes(module *m)

{
  handle hVar1;
  cpp_function cVar2;
  handle hVar3;
  module *pmVar4;
  class_<sdf_tools::real2> *pcVar5;
  class_<sdf_tools::real3> *pcVar6;
  class_<sdf_tools::int3> *pcVar7;
  long lVar8;
  initializer_list<pybind11::detail::field_descriptor> __l;
  initializer_list<pybind11::detail::field_descriptor> __l_00;
  initializer_list<pybind11::detail::field_descriptor> __l_01;
  cpp_function cf_5;
  cpp_function cf;
  handle local_190;
  handle local_188;
  handle local_180;
  arg local_178;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_168;
  module *local_150;
  field_descriptor local_148;
  char *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  char *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_88;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_68;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_48;
  
  local_148.name = "x";
  local_148.offset = 0;
  local_148.size = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_108 = "y";
  local_100 = 4;
  local_f8 = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  __l._M_len = 2;
  __l._M_array = &local_148;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(&local_168,__l,(allocator_type *)&local_178);
  local_48.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pybind11::detail::npy_format_descriptor<sdf_tools::real2,_void>::register_dtype
            ((any_container<pybind11::detail::field_descriptor> *)&local_48);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_48);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_168);
  lVar8 = 0x40;
  do {
    pybind11::detail::field_descriptor::~field_descriptor
              ((field_descriptor *)((long)&local_148.name + lVar8));
    lVar8 = lVar8 + -0x40;
  } while (lVar8 != -0x40);
  local_150 = m;
  pybind11::class_<sdf_tools::real2>::class_<>
            ((class_<sdf_tools::real2> *)&local_188,(m->super_object).super_handle.m_ptr,"real2");
  local_148.name = "x";
  local_148.offset = CONCAT71(local_148.offset._1_7_,2);
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x13be93;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_168.
                         super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,2);
  pybind11::detail::initimpl::constructor<float,_float>::
  execute<pybind11::class_<sdf_tools::real2>,_pybind11::arg,_pybind11::arg,_0>
            ((class_<sdf_tools::real2> *)&local_188,(arg *)&local_148,(arg *)&local_168);
  hVar1.m_ptr = local_188.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf_5,local_188,"__init__",(PyObject *)&_Py_NoneStruct);
  cVar2 = cf_5;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)(local_178.name + 0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_0,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178.name = "__init__";
  *(PyObject **)(local_178.name + 0x70) = hVar1.m_ptr;
  *(function *)(local_178.name + 0x78) = cVar2.super_function.super_object.super_handle.m_ptr;
  local_178.name[0x59] = local_178.name[0x59] | 0x12;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_178,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_0,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&cf_5);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)&local_188,"__init__",&cf);
  pybind11::object::~object((object *)&cf);
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf_5,local_188,"__init__",(PyObject *)&_Py_NoneStruct);
  cVar2 = cf_5;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)(local_178.name + 0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_1,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178.name = "__init__";
  *(PyObject **)(local_178.name + 0x70) = local_188.m_ptr;
  *(function *)(local_178.name + 0x78) = cVar2.super_function.super_object.super_handle.m_ptr;
  local_178.name[0x59] = local_178.name[0x59] | 0x12;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_178,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_1,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&cf_5);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)&local_188,"__init__",&cf);
  pybind11::object::~object((object *)&cf);
  pcVar5 = pybind11::class_<sdf_tools::real2>::def_readwrite<sdf_tools::real2,float>
                     ((class_<sdf_tools::real2> *)&local_188,"x",0);
  pcVar5 = pybind11::class_<sdf_tools::real2>::def_readwrite<sdf_tools::real2,float>(pcVar5,"y",4);
  hVar1.m_ptr = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf_5,hVar1,"__getitem__",(PyObject *)&_Py_NoneStruct);
  cVar2 = cf_5;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)(local_178.name + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_2,float,sdf_tools::real2_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_2&&,float(*)(sdf_tools::real2_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178.name = "__getitem__";
  local_178.name[0x59] = local_178.name[0x59] | 0x10;
  *(PyObject **)(local_178.name + 0x70) = hVar1.m_ptr;
  *(function *)(local_178.name + 0x78) = cVar2.super_function.super_object.super_handle.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_178,"({%}, {int}) -> float",
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_2,float,sdf_tools::real2_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_2&&,float(*)(sdf_tools::real2_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&cf_5);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)pcVar5,"__getitem__",&cf);
  pybind11::object::~object((object *)&cf);
  hVar1.m_ptr = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf_5,hVar1,"__str__",(PyObject *)&_Py_NoneStruct);
  cVar2 = cf_5;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)(local_178.name + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_3,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_3&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178.name = "__str__";
  local_178.name[0x59] = local_178.name[0x59] | 0x10;
  *(PyObject **)(local_178.name + 0x70) = hVar1.m_ptr;
  *(function *)(local_178.name + 0x78) = cVar2.super_function.super_object.super_handle.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_178,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_3,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_3&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_3,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_3&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&cf_5);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)pcVar5,"__str__",&cf);
  pybind11::object::~object((object *)&cf);
  hVar1.m_ptr = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf_5,hVar1,"__repr__",(PyObject *)&_Py_NoneStruct);
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)(local_178.name + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_4,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_4&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178.name = "__repr__";
  local_178.name[0x59] = local_178.name[0x59] | 0x10;
  *(PyObject **)(local_178.name + 0x70) = hVar1.m_ptr;
  *(function *)(local_178.name + 0x78) = cf_5.super_function.super_object.super_handle.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_178,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_4,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_4&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_4,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_4&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&cf_5);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)pcVar5,"__repr__",&cf);
  pybind11::object::~object((object *)&cf);
  pybind11::object::~object((object *)&local_188);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::real2>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::real2>();
  local_148.name = "x";
  local_148.offset = 0;
  local_148.size = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_108 = "y";
  local_100 = 4;
  local_f8 = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_c8 = "z";
  local_c0 = 8;
  local_b8 = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  __l_00._M_len = 3;
  __l_00._M_array = &local_148;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(&local_168,__l_00,(allocator_type *)&local_178);
  local_68.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pybind11::detail::npy_format_descriptor<sdf_tools::real3,_void>::register_dtype
            ((any_container<pybind11::detail::field_descriptor> *)&local_68);
  pmVar4 = local_150;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_68);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_168);
  lVar8 = 0x80;
  do {
    pybind11::detail::field_descriptor::~field_descriptor
              ((field_descriptor *)((long)&local_148.name + lVar8));
    lVar8 = lVar8 + -0x40;
  } while (lVar8 != -0x40);
  pybind11::class_<sdf_tools::real3>::class_<>
            ((class_<sdf_tools::real3> *)&local_180,(pmVar4->super_object).super_handle.m_ptr,
             "real3");
  local_148.name = "x";
  local_148.offset = CONCAT71(local_148.offset._1_7_,2);
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x13be93;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_168.
                         super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,2);
  local_178.name = "z";
  local_178._8_1_ = 2;
  pybind11::detail::initimpl::constructor<float,_float,_float>::
  execute<pybind11::class_<sdf_tools::real3>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            ((class_<sdf_tools::real3> *)&local_180,(arg *)&local_148,(arg *)&local_168,&local_178);
  hVar3.m_ptr = local_180.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,local_180,"__init__",(PyObject *)&_Py_NoneStruct);
  hVar1.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_5,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__init__";
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar3.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar1.m_ptr;
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x12;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_5,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  hVar3.m_ptr = local_180.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,local_180,"__init__",(PyObject *)&_Py_NoneStruct);
  hVar1.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_6,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__init__";
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar3.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar1.m_ptr;
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x12;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_6,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  pcVar6 = pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>
                     ((class_<sdf_tools::real3> *)&local_180,"x",0);
  pcVar6 = pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>(pcVar6,"y",4);
  pcVar6 = pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>(pcVar6,"z",8);
  hVar1.m_ptr = (pcVar6->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,hVar1,"__getitem__",(PyObject *)&_Py_NoneStruct);
  hVar3.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_7,float,sdf_tools::real3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_7&&,float(*)(sdf_tools::real3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__getitem__";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar1.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar3.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,"({%}, {int}) -> float",
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_7,float,sdf_tools::real3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_7&&,float(*)(sdf_tools::real3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar6,"__getitem__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  hVar1.m_ptr = (pcVar6->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,hVar1,"__str__",(PyObject *)&_Py_NoneStruct);
  hVar3.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_8,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_8&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__str__";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar1.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar3.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_8,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_8&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_8,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_8&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar6,"__str__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  hVar1.m_ptr = (pcVar6->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,hVar1,"__repr__",(PyObject *)&_Py_NoneStruct);
  hVar3.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_9,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_9&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__repr__";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar1.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar3.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_9,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_9&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_9,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_9&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar6,"__repr__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  pybind11::object::~object((object *)&local_180);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::real3>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::real3>();
  local_148.name = "x";
  local_148.offset = 0;
  local_148.size = 4;
  pybind11::format_descriptor<int,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  local_108 = "y";
  local_100 = 4;
  local_f8 = 4;
  pybind11::format_descriptor<int,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  local_c8 = "z";
  local_c0 = 8;
  local_b8 = 4;
  pybind11::format_descriptor<int,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  __l_01._M_len = 3;
  __l_01._M_array = &local_148;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(&local_168,__l_01,(allocator_type *)&local_178);
  local_88.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pybind11::detail::npy_format_descriptor<sdf_tools::int3,_void>::register_dtype
            ((any_container<pybind11::detail::field_descriptor> *)&local_88);
  pmVar4 = local_150;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_88);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_168);
  lVar8 = 0x80;
  do {
    pybind11::detail::field_descriptor::~field_descriptor
              ((field_descriptor *)((long)&local_148.name + lVar8));
    lVar8 = lVar8 + -0x40;
  } while (lVar8 != -0x40);
  pybind11::class_<sdf_tools::int3>::class_<>
            ((class_<sdf_tools::int3> *)&local_180,(pmVar4->super_object).super_handle.m_ptr,"int3")
  ;
  local_148.name = "x";
  local_148.offset = CONCAT71(local_148.offset._1_7_,2);
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x13be93;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_168.
                         super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,2);
  local_178.name = "z";
  local_178._8_1_ = 2;
  pybind11::detail::initimpl::constructor<int,_int,_int>::
  execute<pybind11::class_<sdf_tools::int3>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            ((class_<sdf_tools::int3> *)&local_180,(arg *)&local_148,(arg *)&local_168,&local_178);
  hVar3.m_ptr = local_180.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,local_180,"__init__",(PyObject *)&_Py_NoneStruct);
  hVar1.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_10,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__init__";
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar3.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar1.m_ptr;
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x12;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_10,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,local_180,"__init__",(PyObject *)&_Py_NoneStruct);
  hVar1.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_11,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__init__";
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = local_180.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar1.m_ptr;
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x12;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_11,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  pcVar7 = pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>
                     ((class_<sdf_tools::int3> *)&local_180,"x",0);
  pcVar7 = pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>(pcVar7,"y",4);
  pcVar7 = pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>(pcVar7,"z",8);
  hVar1.m_ptr = (pcVar7->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,hVar1,"__getitem__",(PyObject *)&_Py_NoneStruct);
  hVar3.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_12,int,sdf_tools::int3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_12&&,int(*)(sdf_tools::int3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__getitem__";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar1.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar3.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,"({%}, {int}) -> int",
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_12,int,sdf_tools::int3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_12&&,int(*)(sdf_tools::int3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar7,"__getitem__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  hVar1.m_ptr = (pcVar7->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,hVar1,"__str__",(PyObject *)&_Py_NoneStruct);
  hVar3.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_13,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_13&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__str__";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar1.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar3.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_13,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_13&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_13,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_13&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar7,"__str__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  hVar1.m_ptr = (pcVar7->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_190,hVar1,"__repr__",(PyObject *)&_Py_NoneStruct);
  hVar3.m_ptr = local_190.m_ptr;
  cf_5.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_14,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_14&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "__repr__";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70) = hVar1.m_ptr;
  *(PyObject **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) = hVar3.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf_5,(unique_function_record *)&cf,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_14,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_14&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_14,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_14&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar7,"__repr__",&cf_5);
  pybind11::object::~object((object *)&cf_5);
  pybind11::object::~object((object *)&local_180);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::int3>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::int3>();
  return;
}

Assistant:

void exportVectorTypes(py::module &m)
{
    PYBIND11_NUMPY_DTYPE(real2, x, y);
    py::class_<real2>(m, "real2")
        .def(py::init<real, real>(), "x"_a, "y"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 2)
                              throw std::runtime_error("Should have length 2.");
                          return real2{t[0].cast<real>(), t[1].cast<real>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 2)
                              throw std::runtime_error("Should have length 2.");
                          return real2{t[0].cast<real>(), t[1].cast<real>()};
                      }))
        .def_readwrite("x", &real2::x)
        .def_readwrite("y", &real2::y)
        .def("__getitem__",
             [](const real2 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 throw py::index_error();
                 return 0._r;
             })
        .def("__str__", [](const real2 &v) { return "({}, {})"_s.format(v.x, v.y); })
        .def("__repr__",
             [](const real2 &v) { return "real2({}, {})"_s.format(v.x, v.y); });

    py::implicitly_convertible<py::tuple, real2>();
    py::implicitly_convertible<py::list, real2>();



    PYBIND11_NUMPY_DTYPE(real3, x, y, z);
    py::class_<real3>(m, "real3")
        .def(py::init<real, real, real>(), "x"_a, "y"_a, "z"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 3)
                              throw std::runtime_error("Should have length 3.");
                          return real3{t[0].cast<real>(), t[1].cast<real>(), t[2].cast<real>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 3)
                              throw std::runtime_error("Should have length 3.");
                          return real3{t[0].cast<real>(), t[1].cast<real>(), t[2].cast<real>()};
                      }))
        .def_readwrite("x", &real3::x)
        .def_readwrite("y", &real3::y)
        .def_readwrite("z", &real3::z)
        .def("__getitem__",
             [](const real3 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 if (i == 2) return v.z;
                 throw py::index_error();
                 return 0._r;
             })
        .def("__str__", [](const real3 &v) { return "({}, {}, {})"_s.format(v.x, v.y, v.z); })
        .def("__repr__",
             [](const real3 &v) { return "real3({}, {}, {})"_s.format(v.x, v.y, v.z); });

    py::implicitly_convertible<py::tuple, real3>();
    py::implicitly_convertible<py::list, real3>();


    PYBIND11_NUMPY_DTYPE(int3, x, y, z);
    py::class_<int3>(m, "int3")
        .def(py::init<int, int, int>(), "x"_a, "y"_a, "z"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 3) throw std::runtime_error("Should have length 3.");
                          return int3{t[0].cast<int>(), t[1].cast<int>(), t[2].cast<int>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 3) throw std::runtime_error("Should have length 3.");
                          return int3{t[0].cast<int>(), t[1].cast<int>(), t[2].cast<int>()};
                      }))
        .def_readwrite("x", &int3::x)
        .def_readwrite("y", &int3::y)
        .def_readwrite("z", &int3::z)
        .def("__getitem__",
             [](const int3 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 if (i == 2) return v.z;
                 throw py::index_error();
                 return 0;
             })
        .def("__str__", [](const int3 &v) { return "({}, {}, {})"_s.format(v.x, v.y, v.z); })
        .def("__repr__",
             [](const int3 &v) { return "int3({}, {}, {})"_s.format(v.x, v.y, v.z); });

    py::implicitly_convertible<py::tuple, int3>();
    py::implicitly_convertible<py::list, int3>();
}